

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableBeginInitMemory(ImGuiTable *table,int columns_count)

{
  ImGuiTableColumn *pIVar1;
  void *__s;
  int iVar2;
  short *psVar3;
  ImGuiTableCellData *pIVar4;
  uint uVar5;
  long lVar6;
  int aiStack_50 [4];
  undefined4 local_40;
  int iStack_3c;
  undefined8 uStack_38;
  undefined8 local_30;
  int iStack_28;
  int iStack_24;
  undefined8 local_20;
  undefined8 uStack_18;
  
  iStack_3c = columns_count * 0x70;
  local_30 = 0;
  uStack_18 = 0;
  iStack_24 = columns_count * 2;
  local_40 = 0;
  uVar5 = columns_count * 0x72 + 3;
  iVar2 = (uVar5 & 0xfffffffc) + columns_count * 8;
  uStack_38 = (ulong)uVar5 & 0xfffffffffffffffc;
  local_20 = (ulong)(uint)(columns_count << 3);
  uVar5 = columns_count + 0x1f >> 3 & 0xfffffffc;
  lVar6 = 7;
  do {
    aiStack_50[lVar6] = iVar2;
    *(uint *)((long)&uStack_38 + lVar6 * 4) = uVar5;
    iVar2 = iVar2 + uVar5;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 10);
  iStack_28 = iStack_3c;
  __s = MemAlloc((long)iVar2);
  table->RawData = __s;
  memset(__s,0,(long)iVar2);
  pIVar1 = (ImGuiTableColumn *)table->RawData;
  (table->Columns).Data = pIVar1;
  (table->Columns).DataEnd = (ImGuiTableColumn *)((long)&pIVar1->Flags + (long)iStack_28);
  psVar3 = (short *)((long)&pIVar1->Flags + (long)iStack_3c);
  (table->DisplayOrderToIndex).Data = psVar3;
  (table->DisplayOrderToIndex).DataEnd = (short *)((long)iStack_24 + (long)psVar3);
  pIVar4 = (ImGuiTableCellData *)((long)&pIVar1->Flags + (long)(int)uStack_38);
  (table->RowCellData).Data = pIVar4;
  (table->RowCellData).DataEnd =
       (ImGuiTableCellData *)((long)&pIVar4->BgColor + (long)(int)local_20);
  table->EnabledMaskByDisplayOrder = (ImBitArrayPtr)((long)&pIVar1->Flags + (long)uStack_38._4_4_);
  table->EnabledMaskByIndex = (ImBitArrayPtr)((long)&pIVar1->Flags + (long)(int)local_30);
  table->VisibleMaskByIndex = (ImBitArrayPtr)((long)&pIVar1->Flags + (long)local_30._4_4_);
  return;
}

Assistant:

void ImGui::TableBeginInitMemory(ImGuiTable* table, int columns_count)
{
    // Allocate single buffer for our arrays
    const int columns_bit_array_size = (int)ImBitArrayGetStorageSizeInBytes(columns_count);
    ImSpanAllocator<6> span_allocator;
    span_allocator.Reserve(0, columns_count * sizeof(ImGuiTableColumn));
    span_allocator.Reserve(1, columns_count * sizeof(ImGuiTableColumnIdx));
    span_allocator.Reserve(2, columns_count * sizeof(ImGuiTableCellData), 4);
    for (int n = 3; n < 6; n++)
        span_allocator.Reserve(n, columns_bit_array_size);
    table->RawData = IM_ALLOC(span_allocator.GetArenaSizeInBytes());
    memset(table->RawData, 0, span_allocator.GetArenaSizeInBytes());
    span_allocator.SetArenaBasePtr(table->RawData);
    span_allocator.GetSpan(0, &table->Columns);
    span_allocator.GetSpan(1, &table->DisplayOrderToIndex);
    span_allocator.GetSpan(2, &table->RowCellData);
    table->EnabledMaskByDisplayOrder = (ImU32*)span_allocator.GetSpanPtrBegin(3);
    table->EnabledMaskByIndex = (ImU32*)span_allocator.GetSpanPtrBegin(4);
    table->VisibleMaskByIndex = (ImU32*)span_allocator.GetSpanPtrBegin(5);
}